

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<float,std::vector<double,std::allocator<double>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  uint uVar1;
  int iVar2;
  reference pvVar3;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R9;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __value;
  double extraout_XMM0_Qa_02;
  double __value_00;
  double extraout_XMM0_Qa_03;
  double __value_01;
  size_t row;
  longdouble w_this;
  longdouble n_prev;
  longdouble out;
  longdouble n;
  longdouble diff;
  longdouble delta_div;
  longdouble delta_s;
  longdouble delta;
  longdouble M4;
  longdouble M3;
  longdouble M2;
  longdouble m;
  double local_128;
  undefined8 local_11c;
  undefined2 in_stack_fffffffffffffeec;
  bool bVar7;
  byte in_stack_fffffffffffffeef;
  float *in_stack_fffffffffffffef0;
  double in_stack_fffffffffffffef8;
  size_t *ix_arr_00;
  longdouble in_stack_ffffffffffffff08;
  longdouble local_e8;
  longdouble local_c8;
  longdouble local_78;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  double local_8;
  
  local_e8 = (longdouble)0;
  local_c8 = local_e8;
  local_78 = local_e8;
  local_68 = local_e8;
  local_58 = local_e8;
  local_48 = local_e8;
  for (; ix_arr_00 = SUB108(in_stack_ffffffffffffff08,0), in_RSI <= in_RDX; in_RSI = in_RSI + 1) {
    uVar1 = std::isnan((double)(ulong)*(uint *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 4));
    in_stack_fffffffffffffeef = 1;
    in_XMM0_Qa = extraout_XMM0_Qa;
    if ((uVar1 & 1) == 0) {
      iVar2 = std::isinf((double)(ulong)*(uint *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 4));
      in_stack_fffffffffffffeef = (byte)iVar2;
      in_XMM0_Qa = extraout_XMM0_Qa_00;
    }
    if (((in_stack_fffffffffffffeef ^ 0xff) & 1) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_R9,*(size_type *)(in_RDI + in_RSI * 8));
      in_stack_ffffffffffffff08 = (longdouble)*pvVar3;
      local_c8 = local_c8 + in_stack_ffffffffffffff08;
      lVar5 = (longdouble)*(float *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 4) - local_48;
      lVar6 = lVar5 / local_c8;
      lVar5 = local_e8 * lVar6 * lVar5;
      local_48 = in_stack_ffffffffffffff08 * lVar6 + local_48;
      lVar4 = (longdouble)3.0;
      local_78 = in_stack_ffffffffffffff08 *
                 (local_68 * (longdouble)-4.0 * lVar6 +
                 lVar5 * lVar6 * lVar6 * ((local_c8 * local_c8 - local_c8 * lVar4) + lVar4) +
                 local_58 * (longdouble)6.0 * lVar6 * lVar6) + local_78;
      local_68 = local_68 +
                 in_stack_ffffffffffffff08 *
                 (((longdouble)-2.0 + local_c8) * lVar5 * lVar6 - local_58 * lVar6 * lVar4);
      local_58 = in_stack_ffffffffffffff08 * lVar5 + local_58;
      in_XMM0_Qa = extraout_XMM0_Qa_01;
      local_e8 = local_c8;
    }
  }
  if (local_c8 <= (longdouble)0) {
    local_8 = -INFINITY;
  }
  else {
    uVar1 = std::isnan(in_XMM0_Qa);
    bVar7 = false;
    __value_00 = __value;
    if ((uVar1 & 1) == 0) {
      uVar1 = std::isinf(__value);
      bVar7 = false;
      __value_00 = extraout_XMM0_Qa_02;
      if ((uVar1 & 1) == 0) {
        local_11c = SUB108(local_58,0);
        in_stack_fffffffffffffeec = (undefined2)((unkuint10)local_58 >> 0x40);
        __value_00 = std::numeric_limits<double>::epsilon();
        bVar7 = (longdouble)CONCAT28(in_stack_fffffffffffffeec,local_11c) <= (longdouble)__value_00;
        in_stack_fffffffffffffef8 = __value_00;
      }
    }
    if ((bVar7 == false) ||
       (bVar7 = check_more_than_two_unique_values<float>
                          (ix_arr_00,in_RSI,(size_t)in_stack_fffffffffffffef8,
                           in_stack_fffffffffffffef0,
                           CONCAT13(in_stack_fffffffffffffeef,
                                    CONCAT12(bVar7,in_stack_fffffffffffffeec))),
       __value_00 = extraout_XMM0_Qa_03, bVar7)) {
      uVar1 = std::isnan(__value_00);
      if (((uVar1 & 1) == 0) && (uVar1 = std::isinf(__value_01), (uVar1 & 1) == 0)) {
        local_128 = (double)((local_c8 / local_58) * (local_78 / local_58));
        if (local_128 <= 0.0) {
          local_128 = 0.0;
        }
      }
      else {
        local_128 = -INFINITY;
      }
      local_8 = local_128;
    }
    else {
      local_8 = -INFINITY;
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis_weighted(size_t ix_arr[], size_t st, size_t end, real_t x[],
                              MissingAction missing_action, mapping &restrict w)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff;
    ldouble_safe n = 0;
    ldouble_safe out;
    ldouble_safe n_prev = 0.;
    ldouble_safe w_this;

    for (size_t row = st; row <= end; row++)
    {
        if (likely(!is_na_or_inf(x[ix_arr[row]])))
        {
            w_this = w[ix_arr[row]];
            n += w_this;

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * n_prev);
            n_prev     =  n;

            m   +=  w_this * (delta_div);
            M4  +=  w_this * (diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3);
            M3  +=  w_this * (diff * delta_div * (n - 2) - 3 * delta_div * M2);
            M2  +=  w_this * (diff);
        }
    }

    if (unlikely(n <= 0)) return -HUGE_VAL;
    if (unlikely(!is_na_or_inf(M2) && M2 <= std::numeric_limits<double>::epsilon()))
    {
        if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
            return -HUGE_VAL;
    }

    out = ( M4 / M2 ) * ( n / M2 );
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}